

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

basic_ostream<char,_std::char_traits<char>_> *
math::wide_integer::operator<<
          (basic_ostream<char,_std::char_traits<char>_> *out,
          uintwide_t<24U,_unsigned_char,_void,_false> *x)

{
  value_type *pvVar1;
  char fill_char_str;
  fmtflags __a;
  _Ios_Fmtflags _Var2;
  unsigned_fast_type field_width_00;
  iterator str_result_00;
  pointer pcVar3;
  iterator str_result_01;
  pointer pcVar4;
  iterator str_result_02;
  pointer pcVar5;
  ostream *poVar6;
  bool show_pos_00;
  bool show_base_00;
  bool is_uppercase_00;
  string local_908 [36];
  value_type local_8e4;
  undefined1 local_8e3 [8];
  string_storage_hex_type str_result_2;
  string_storage_dec_type str_result_1;
  string_storage_oct_type str_result;
  char fill_char_out;
  unsigned_fast_type field_width;
  uint_fast8_t base_rep;
  bool is_uppercase;
  bool show_base;
  bool show_pos;
  fmtflags my_flags;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> ostr;
  uintwide_t<24U,_unsigned_char,_void,_false> *x_local;
  basic_ostream<char,_std::char_traits<char>_> *out_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&base_rep);
  __a = std::ios_base::flags((ios_base *)(out + *(long *)(*(long *)out + -0x18)));
  _Var2 = std::operator&(__a,_S_showpos);
  show_pos_00 = _Var2 == _S_showpos;
  _Var2 = std::operator&(__a,_S_showbase);
  show_base_00 = _Var2 == _S_showbase;
  _Var2 = std::operator&(__a,_S_uppercase);
  is_uppercase_00 = _Var2 == _S_uppercase;
  _Var2 = std::operator&(__a,_S_oct);
  if (_Var2 == _S_oct) {
    field_width._0_1_ = '\b';
  }
  else {
    _Var2 = std::operator&(__a,_S_hex);
    if (_Var2 == _S_hex) {
      field_width._0_1_ = '\x10';
    }
    else {
      field_width._0_1_ = '\n';
    }
  }
  field_width_00 = std::ios_base::width((ios_base *)(out + *(long *)(*(long *)out + -0x18)));
  fill_char_str = std::ios::fill();
  if ((char)field_width == '\b') {
    pvVar1 = str_result_1.super_array<char,_626UL>.elems + 0x26b;
    memset(pvVar1,0,0x2b3);
    detail::fixed_static_array<char,_691U>::fixed_static_array
              ((fixed_static_array<char,_691U> *)pvVar1);
    str_result_1.super_array<char,_626UL>.elems[0x26a] = '\0';
    detail::array_detail::array<char,_691UL>::fill
              ((array<char,_691UL> *)pvVar1,str_result_1.super_array<char,_626UL>.elems + 0x26a);
    str_result_00 =
         detail::array_detail::array<char,_691UL>::begin
                   ((array<char,_691UL> *)(str_result_1.super_array<char,_626UL>.elems + 0x26b));
    uintwide_t<2048u,unsigned_int,void,false>::wr_string<char*>
              ((uintwide_t<2048u,unsigned_int,void,false> *)x,str_result_00,'\b',show_base_00,
               show_pos_00,is_uppercase_00,field_width_00,fill_char_str);
    pcVar3 = detail::array_detail::array<char,_691UL>::data
                       ((array<char,_691UL> *)(str_result_1.super_array<char,_626UL>.elems + 0x26b))
    ;
    std::operator<<((ostream *)&base_rep,pcVar3);
  }
  else if ((char)field_width == '\n') {
    pvVar1 = str_result_2.super_array<char,_520UL>.elems + 0x201;
    memset(pvVar1,0,0x272);
    detail::fixed_static_array<char,_626U>::fixed_static_array
              ((fixed_static_array<char,_626U> *)pvVar1);
    str_result_2.super_array<char,_520UL>.elems[0x200] = '\0';
    detail::array_detail::array<char,_626UL>::fill
              ((array<char,_626UL> *)pvVar1,str_result_2.super_array<char,_520UL>.elems + 0x200);
    str_result_01 =
         detail::array_detail::array<char,_626UL>::begin
                   ((array<char,_626UL> *)(str_result_2.super_array<char,_520UL>.elems + 0x201));
    uintwide_t<2048u,unsigned_int,void,false>::wr_string<char*>
              ((uintwide_t<2048u,unsigned_int,void,false> *)x,str_result_01,'\n',show_base_00,
               show_pos_00,is_uppercase_00,field_width_00,fill_char_str);
    pcVar4 = detail::array_detail::array<char,_626UL>::data
                       ((array<char,_626UL> *)(str_result_2.super_array<char,_520UL>.elems + 0x201))
    ;
    std::operator<<((ostream *)&base_rep,pcVar4);
  }
  else if ((char)field_width == '\x10') {
    memset((array<char,_520UL> *)local_8e3,0,0x208);
    detail::fixed_static_array<char,_520U>::fixed_static_array
              ((fixed_static_array<char,_520U> *)local_8e3);
    local_8e4 = '\0';
    detail::array_detail::array<char,_520UL>::fill((array<char,_520UL> *)local_8e3,&local_8e4);
    str_result_02 = detail::array_detail::array<char,_520UL>::begin((array<char,_520UL> *)local_8e3)
    ;
    uintwide_t<2048u,unsigned_int,void,false>::wr_string<char*>
              ((uintwide_t<2048u,unsigned_int,void,false> *)x,str_result_02,'\x10',show_base_00,
               show_pos_00,is_uppercase_00,field_width_00,fill_char_str);
    pcVar5 = detail::array_detail::array<char,_520UL>::data((array<char,_520UL> *)local_8e3);
    std::operator<<((ostream *)&base_rep,pcVar5);
  }
  std::__cxx11::ostringstream::str();
  poVar6 = std::operator<<(out,local_908);
  std::__cxx11::string::~string(local_908);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&base_rep);
  return poVar6;
}

Assistant:

auto operator<<(std::basic_ostream<char_type, traits_type>& out,
                  const uintwide_t<Width2, LimbType, AllocatorType, IsSigned>& x) -> std::basic_ostream<char_type, traits_type>&
  {
    std::basic_ostringstream<char_type, traits_type> ostr;

    const std::ios::fmtflags my_flags = out.flags();

    const auto show_pos     = ((my_flags & std::ios::showpos)   == std::ios::showpos);
    const auto show_base    = ((my_flags & std::ios::showbase)  == std::ios::showbase);
    const auto is_uppercase = ((my_flags & std::ios::uppercase) == std::ios::uppercase);

    auto base_rep = std::uint_fast8_t { };

    if     ((my_flags & std::ios::oct) == std::ios::oct) { base_rep = static_cast<std::uint_fast8_t>(UINT8_C( 8)); }
    else if((my_flags & std::ios::hex) == std::ios::hex) { base_rep = static_cast<std::uint_fast8_t>(UINT8_C(16)); }
    else                                                 { base_rep = static_cast<std::uint_fast8_t>(UINT8_C(10)); }

    const auto field_width   = static_cast<unsigned_fast_type>(out.width());
    const auto fill_char_out = static_cast<char>(out.fill());

    using local_wide_integer_type = uintwide_t<Width2, LimbType, AllocatorType, IsSigned>;

    if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(8)))
    {
      using string_storage_oct_type =
        std::conditional_t
          <local_wide_integer_type::my_width2 <= static_cast<size_t>(UINT32_C(2048)),
            detail::fixed_static_array <char,
                                        local_wide_integer_type::wr_string_max_buffer_size_oct()>,
            detail::fixed_dynamic_array<char,
                                        local_wide_integer_type::wr_string_max_buffer_size_oct(),
                                        typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                         std::allocator<void>,
                                                                                         AllocatorType>>::template rebind_alloc<typename local_wide_integer_type::limb_type>>>;

      // TBD: There is redundant storage of this kind both here
      // in this subroutine as well as in the wr_string method.
      string_storage_oct_type str_result { }; // LCOV_EXCL_LINE

      str_result.fill('\0');

      x.wr_string(str_result.begin(), base_rep, show_base, show_pos, is_uppercase, field_width, fill_char_out);

      static_cast<void>(ostr << str_result.data());
    }
    else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(10)))
    {
      using string_storage_dec_type =
        std::conditional_t
          <local_wide_integer_type::my_width2 <= static_cast<size_t>(UINT32_C(2048)),
            detail::fixed_static_array <char,
                                        local_wide_integer_type::wr_string_max_buffer_size_dec()>,
            detail::fixed_dynamic_array<char,
                                        local_wide_integer_type::wr_string_max_buffer_size_dec(),
                                        typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                          std::allocator<void>,
                                                                                          AllocatorType>>::template rebind_alloc<typename local_wide_integer_type::limb_type>>>;

      // TBD: There is redundant storage of this kind both here
      // in this subroutine as well as in the wr_string method.
      string_storage_dec_type str_result { };

      str_result.fill('\0');

      x.wr_string(str_result.begin(), base_rep, show_base, show_pos, is_uppercase, field_width, fill_char_out);

      static_cast<void>(ostr << str_result.data());
    }
    else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(16)))
    {
      using string_storage_hex_type =
        std::conditional_t
          <local_wide_integer_type::my_width2 <= static_cast<size_t>(UINT32_C(2048)),
            detail::fixed_static_array <char,
                                        local_wide_integer_type::wr_string_max_buffer_size_hex()>,
            detail::fixed_dynamic_array<char,
                                        local_wide_integer_type::wr_string_max_buffer_size_hex(),
                                        typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                         std::allocator<void>,
                                                                                         AllocatorType>>::template rebind_alloc<typename local_wide_integer_type::limb_type>>>;

      // TBD: There is redundant storage of this kind both here
      // in this subroutine as well as in the wr_string method.
      string_storage_hex_type str_result { };

      str_result.fill('\0');

      x.wr_string(str_result.begin(), base_rep, show_base, show_pos, is_uppercase, field_width, fill_char_out);

      static_cast<void>(ostr << str_result.data());
    }

    return (out << ostr.str());
  }